

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x25519.c
# Opt level: O3

int x25519_create_key_exchange
              (ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **_ctx)

{
  int iVar1;
  ptls_key_exchange_context_t *ppVar2;
  
  ppVar2 = (ptls_key_exchange_context_t *)malloc(0x60);
  if (ppVar2 == (ptls_key_exchange_context_t *)0x0) {
    iVar1 = 0x201;
  }
  else {
    ppVar2->algo = algo;
    (ppVar2->pubkey).base = (uint8_t *)(ppVar2 + 2);
    (ppVar2->pubkey).len = 0x20;
    ppVar2->on_exchange = x25519_on_exchange;
    ptls_minicrypto_random_bytes(ppVar2 + 1,0x20);
    cf_curve25519_mul_base((uint8_t *)(ppVar2 + 2),(uint8_t *)(ppVar2 + 1));
    *_ctx = ppVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int x25519_create_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **_ctx)
{
    struct st_x25519_key_exchange_t *ctx;

    if ((ctx = (struct st_x25519_key_exchange_t *)malloc(sizeof(*ctx))) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    ctx->super = (ptls_key_exchange_context_t){algo, ptls_iovec_init(ctx->pub, sizeof(ctx->pub)), x25519_on_exchange};
    x25519_create_keypair(ctx->priv, ctx->pub);

    *_ctx = &ctx->super;
    return 0;
}